

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
RegisterBuildTestMissingInput::RegisterBuildTestMissingInput(RegisterBuildTestMissingInput *this)

{
  RegisterBuildTestMissingInput *this_local;
  
  RegisterTest(BuildTestMissingInput::Create,"BuildTest.MissingInput");
  return;
}

Assistant:

TEST_F(BuildTest, MissingInput) {
  // Input is referenced by build file, but no rule for it.
  string err;
  Dirty("in1");
  EXPECT_FALSE(builder_.AddTarget("cat1", &err));
  EXPECT_EQ("'in1', needed by 'cat1', missing and no known rule to make it",
            err);
}